

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall ON_SerialNumberMap::LastElement(ON_SerialNumberMap *this)

{
  uint uVar1;
  SN_ELEMENT *pSVar2;
  SN_ELEMENT *pSVar3;
  SN_ELEMENT *pSVar4;
  long lVar5;
  ON__UINT64 OVar6;
  SN_ELEMENT *pSVar7;
  ON_SN_BLOCK *pOVar8;
  bool bVar9;
  
  pOVar8 = this->m_sn_block0;
  uVar1 = pOVar8->m_purged;
  if (uVar1 < pOVar8->m_count) {
    if (uVar1 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - (ulong)uVar1;
      this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
      ON_SN_BLOCK::CullBlockHelper(pOVar8);
      pOVar8 = this->m_sn_block0;
    }
    if (pOVar8->m_sorted == 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(pOVar8);
      pOVar8 = this->m_sn_block0;
    }
    pSVar4 = pOVar8->m_sn + (pOVar8->m_count - 1);
  }
  else {
    pSVar4 = (SN_ELEMENT *)0x0;
  }
  OVar6 = this->m_snblk_list_count;
  do {
    bVar9 = OVar6 == 0;
    OVar6 = OVar6 - 1;
    if (bVar9) {
      return pSVar4;
    }
    pOVar8 = this->m_snblk_list[OVar6];
    uVar1 = pOVar8->m_count;
  } while (uVar1 <= pOVar8->m_purged);
  if ((pSVar4 == (SN_ELEMENT *)0x0) || (pSVar3 = pSVar4, pSVar4->m_sn <= pOVar8->m_sn1)) {
    lVar5 = (ulong)uVar1 + 1;
    pSVar7 = pOVar8->m_sn + uVar1;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        return pSVar4;
      }
      pSVar2 = pSVar7 + -1;
      pSVar3 = pSVar7 + -1;
      pSVar7 = pSVar7 + -1;
    } while (pSVar2->m_sn_active == '\0');
  }
  return pSVar3;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::LastElement() const
{
  struct SN_ELEMENT* e=0;
  ON__UINT64 i,j;

  // Last element is likely to be m_sn_block0.m_sn[m_sn_block0.m_count-1]
  // so start looking there.
  if ( m_sn_block0.m_count > m_sn_block0.m_purged )
  {
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort m_sn_block0
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[m_sn_block0.m_count-1]);
  }

  i = (ON__UINT64)m_snblk_list_count;
  while(i--)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      if (e && e->m_sn > m_snblk_list[i]->m_sn1 )
        break;
      j = m_snblk_list[i]->m_count;
      while(j--)
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  return e;
}